

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darPrec.c
# Opt level: O0

void Dar_Permutations_rec(char **pRes,int nFact,int n,char *Array)

{
  char cVar1;
  int nFact_00;
  int iVar2;
  int local_3c;
  int k;
  int iLast;
  int iCur;
  int iTemp;
  int nFactNext;
  char **pNext;
  char *Array_local;
  int n_local;
  int nFact_local;
  char **pRes_local;
  
  if (n == 1) {
    **pRes = *Array;
  }
  else {
    nFact_00 = nFact / n;
    iVar2 = n + -1;
    for (k = 0; k < n; k = k + 1) {
      cVar1 = Array[k];
      Array[k] = Array[iVar2];
      Array[iVar2] = cVar1;
      for (local_3c = 0; local_3c < nFact_00; local_3c = local_3c + 1) {
        (pRes + ((n + -1) - k) * nFact_00)[local_3c][iVar2] = Array[iVar2];
      }
      Dar_Permutations_rec(pRes + ((n + -1) - k) * nFact_00,nFact_00,n + -1,Array);
      cVar1 = Array[k];
      Array[k] = Array[iVar2];
      Array[iVar2] = cVar1;
    }
  }
  return;
}

Assistant:

void Dar_Permutations_rec( char ** pRes, int nFact, int n, char Array[] )
{
    char ** pNext;
    int nFactNext;
    int iTemp, iCur, iLast, k;

    if ( n == 1 )
    {
        pRes[0][0] = Array[0];
        return;
    }

    // get the next factorial
    nFactNext = nFact / n;
    // get the last entry
    iLast = n - 1;

    for ( iCur = 0; iCur < n; iCur++ )
    {
        // swap Cur and Last
        iTemp        = Array[iCur];
        Array[iCur]  = Array[iLast];
        Array[iLast] = iTemp;

        // get the pointer to the current section
        pNext = pRes + (n - 1 - iCur) * nFactNext;

        // set the last entry 
        for ( k = 0; k < nFactNext; k++ )
            pNext[k][iLast] = Array[iLast];

        // call recursively for this part
        Dar_Permutations_rec( pNext, nFactNext, n - 1, Array );

        // swap them back
        iTemp        = Array[iCur];
        Array[iCur]  = Array[iLast];
        Array[iLast] = iTemp;
    }
}